

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methodarea.cpp
# Opt level: O1

ClassRuntime * __thiscall MethodArea::loadClassNamed(MethodArea *this,string *className)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  iterator iVar6;
  long *plVar7;
  FILE *__stream;
  ClassLoader *this_00;
  ClassFile *classFile;
  ClassRuntime *this_01;
  ExecutionEngine *this_02;
  VMStack *this_03;
  Frame *this_04;
  ostream *poVar8;
  long *plVar9;
  string classNameStr;
  string classFormat;
  string classLocation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 *local_148;
  string *local_140;
  undefined1 local_138 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  vector<Value,_std::allocator<Value>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>_>
                  *)this,className);
  p_Var1 = &(this->_classes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar5._M_node != p_Var1) {
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>_>
                    *)this,className);
    if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
      return *(ClassRuntime **)(iVar6._M_node + 2);
    }
    return (ClassRuntime *)0x0;
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  pcVar2 = (className->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar2,pcVar2 + className->_M_string_length);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,".class","");
  if ((local_168._M_string_length < local_140) ||
     (iVar4 = std::__cxx11::string::compare
                        ((ulong)&local_168,local_168._M_string_length - (long)local_140,local_140),
     iVar4 != 0)) {
    std::operator+(&local_70,&local_128,&local_168);
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_148);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_40 = *plVar9;
      lStack_38 = plVar7[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar9;
      local_50 = (long *)*plVar7;
    }
    local_48 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  __stream = fopen(local_168._M_dataplus._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    this_00 = ClassLoader::getInstance();
    classFile = ClassLoader::readClassFile(this_00,(FILE *)__stream);
    this_01 = (ClassRuntime *)operator_new(0x38);
    ClassRuntime::ClassRuntime(this_01,classFile);
    addClass(this,this_01);
    fclose(__stream);
    this_02 = ExecutionEngine::getInstance();
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"<clinit>","");
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"()V","");
    bVar3 = ExecutionEngine::doesMethodExist(this_02,this_01,&local_a8,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (bVar3) {
      this_03 = VMStack::getInstance();
      this_04 = (Frame *)operator_new(0xb8);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"<clinit>","");
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"()V","");
      local_88.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_88.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_88.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      Frame::Frame(this_04,this_01,&local_e8,&local_108,&local_88);
      if (local_88.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      VMStack::addFrame(this_03,this_04);
    }
    if (local_148 != local_138) {
      operator_delete(local_148);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    return this_01;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"NoClassDefFoundError: ",0x16);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_168._M_dataplus._M_p,local_168._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar8);
  exit(1);
}

Assistant:

ClassRuntime* MethodArea::loadClassNamed(const string &className) {
    // se a classe já tiver sido carregada, retorna-la
    if (_classes.count(className) > 0) {
        return getClassNamed(className);
    }
    
    string classNameStr(className);
    string classLocation("");
    string classFormat(".class");
    
    if (classNameStr.size() < classFormat.size() || classNameStr.compare(classNameStr.size() - classFormat.size(), classFormat.size(), classFormat) != 0) {
        classNameStr = classLocation + classNameStr + classFormat; // concatena com ".class"
    }

    FILE *fp = fopen(classNameStr.c_str(), "rb");
    if (fp == NULL) {
        cerr << "NoClassDefFoundError: " << classNameStr << endl;
        exit(1);
    }
    
    ClassLoader &classLoader = ClassLoader::getInstance();
    ClassFile *classFile = classLoader.readClassFile(fp);
    ClassRuntime *classRuntime = new ClassRuntime(classFile);
    addClass(classRuntime);
    fclose(fp);
    
    // adicionando <clinit> da classe (se existir) na stack frame.
    ExecutionEngine &executionEngine = ExecutionEngine::getInstance();
    bool existsClinit = executionEngine.doesMethodExist(classRuntime, "<clinit>", "()V");
    if (existsClinit) {
        VMStack &stackFrame = VMStack::getInstance();
        Frame *newFrame = new Frame(classRuntime, "<clinit>", "()V");
        stackFrame.addFrame(newFrame);
    }
    
    return classRuntime;
}